

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O1

void __thiscall
Database::ExecuteQueries<std::_List_iterator<std::__cxx11::string>>
          (Database *this,
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end)

{
  bool bVar1;
  undefined8 *puVar2;
  Bulk_Query_Context qc;
  Database_Result local_48;
  
  bVar1 = BeginTransaction(this);
  if (bVar1) {
    if (begin._M_node != end._M_node) {
      do {
        RawQuery(&local_48,this,(char *)begin._M_node[1]._M_next,false);
        std::
        vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
        ::~vector(&local_48.
                   super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 );
        begin._M_node = (begin._M_node)->_M_next;
      } while (begin._M_node != end._M_node);
    }
    if (bVar1) {
      Commit(this);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_001d34e8;
  puVar2[1] = "Cannot execute bulk query with transaction in progress";
  __cxa_throw(puVar2,&Database_Exception::typeinfo,std::exception::~exception);
}

Assistant:

void ExecuteQueries(IT begin, IT end)
		{
			using namespace std::placeholders;

			Bulk_Query_Context qc(*this);

			if (!qc.Pending())
				throw Database_Exception("Cannot execute bulk query with transaction in progress");

			std::for_each(begin, end, std::bind(&Bulk_Query_Context::RawQuery, &qc, _1));

			qc.Commit();
		}